

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

Primer * __thiscall ASDCP::MXF::Primer::WriteToBuffer(Primer *this,FrameBuffer *Buffer)

{
  bool bVar1;
  long in_RDX;
  MemIOWriter MemWRT;
  FrameBuffer LocalTagBuffer;
  MemIOWriter MStack_c8;
  FrameBuffer local_b8;
  undefined4 local_90 [26];
  
  if (Buffer[5]._vptr_FrameBuffer != (_func_int **)0x0) {
    FrameBuffer::FrameBuffer(&local_b8);
    Kumu::MemIOWriter::MemIOWriter
              (&MStack_c8,(byte_t *)(*(long *)(in_RDX + 8) + 0x14),*(int *)(in_RDX + 0x10) - 0x14);
    bVar1 = FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>::
            Archive((FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>
                     *)&Buffer[3].m_Capacity,&MStack_c8);
    if (bVar1) {
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)&Kumu::RESULT_OK);
    }
    else {
      local_90[0] = 0x205;
      Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
    }
    if (-1 < *(int *)&(this->super_KLVFilePacket).super_KLVPacket._vptr_KLVPacket) {
      (*Buffer->_vptr_FrameBuffer[8])(local_90,Buffer);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_90);
      Kumu::Result_t::~Result_t((Result_t *)local_90);
      if (-1 < *(int *)&(this->super_KLVFilePacket).super_KLVPacket._vptr_KLVPacket) {
        *(int *)(in_RDX + 0x18) = *(int *)(in_RDX + 0x18) + MStack_c8.m_size;
      }
    }
    FrameBuffer::~FrameBuffer(&local_b8);
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                0x202,
                "virtual ASDCP::Result_t ASDCP::MXF::Primer::WriteToBuffer(ASDCP::FrameBuffer &)");
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Primer::WriteToBuffer(ASDCP::FrameBuffer& Buffer)
{
  assert(m_Dict);
  ASDCP::FrameBuffer LocalTagBuffer;
  Kumu::MemIOWriter MemWRT(Buffer.Data() + kl_length, Buffer.Capacity() - kl_length);
  Result_t result = LocalTagEntryBatch.Archive(&MemWRT) ? RESULT_OK : RESULT_KLV_CODING(__LINE__, __FILE__);

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t packet_length = MemWRT.Length();
      result = WriteKLToBuffer(Buffer, packet_length);

      if ( ASDCP_SUCCESS(result) )
	Buffer.Size(Buffer.Size() + packet_length);
    }

  return result;
}